

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalBlockwiseNLJoin::Finalize
          (PhysicalBlockwiseNLJoin *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  GlobalSinkState *pGVar1;
  byte bVar2;
  SinkFinalizeType SVar3;
  
  pGVar1 = input->global_state;
  OuterJoinMarker::Initialize
            ((OuterJoinMarker *)
             ((long)&pGVar1[2].super_StateWithBlockableTasks.blocked_tasks.
                     super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                     super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                     ._M_impl.super__Vector_impl_data + 8),*(idx_t *)&pGVar1[1].state);
  if ((*(long *)&pGVar1[1].state == 0) &&
     (bVar2 = (this->super_PhysicalJoin).super_CachingPhysicalOperator.field_0x81 - 2, bVar2 < 9)) {
    SVar3 = (&DAT_02030532)[bVar2];
  }
  else {
    SVar3 = READY;
  }
  return SVar3;
}

Assistant:

SinkFinalizeType PhysicalBlockwiseNLJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                   OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<BlockwiseNLJoinGlobalState>();
	gstate.right_outer.Initialize(gstate.right_chunks.Count());

	if (gstate.right_chunks.Count() == 0 && EmptyResultIfRHSIsEmpty()) {
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}
	return SinkFinalizeType::READY;
}